

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O2

void __thiscall VGMPlayer::Cmd_Ofs16_Data8(VGMPlayer *this)

{
  UINT8 *pUVar1;
  CHIP_DEVICE *pCVar2;
  ulong uVar3;
  
  pCVar2 = GetDevicePtr(this,_CMD_INFO[this->_fileData[this->_filePos]].chipType,
                        this->_fileData[(ulong)this->_filePos + 1] >> 7);
  if ((pCVar2 != (CHIP_DEVICE *)0x0) && (pCVar2->writeM8 != (DEVFUNC_WRITE_A16D8)0x0)) {
    pUVar1 = this->_fileData;
    uVar3 = (ulong)this->_filePos;
    (*pCVar2->writeM8)((pCVar2->base).defInf.dataPtr,
                       (pUVar1[uVar3 + 1] & 0x7f) << 8 | (ushort)pUVar1[uVar3 + 2],pUVar1[uVar3 + 3]
                      );
    return;
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_Ofs16_Data8(void)
{
	UINT8 chipType = _CMD_INFO[fData[0x00]].chipType;
	UINT8 chipID = (fData[0x01] & 0x80) >> 7;
	CHIP_DEVICE* cDev = GetDevicePtr(chipType, chipID);
	if (cDev == NULL || cDev->writeM8 == NULL)
		return;
	
	UINT16 ofs = ReadBE16(&fData[0x01]) & 0x7FFF;
	cDev->writeM8(cDev->base.defInf.dataPtr, ofs, fData[0x03]);
	return;
}